

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

extent_split_interior_result_t
extent_split_interior
          (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,edata_t **edata,edata_t **lead,edata_t **trail,
          edata_t **to_leak,edata_t **to_salvage,edata_t *expand_edata,size_t size,size_t alignment)

{
  ulong uVar1;
  edata_t *peVar2;
  ulong uVar3;
  ulong uVar4;
  edata_t *peVar5;
  size_t size_a;
  undefined1 in_stack_ffffffffffffffb8;
  
  uVar1 = (ulong)(*edata)->e_addr & 0xfffffffffffff000;
  uVar3 = size + 0xfff & 0xfffffffffffff000;
  uVar3 = -uVar3 & (uVar3 + uVar1) - 1;
  uVar4 = ((*edata)->field_2).e_size_esn & 0xfffffffffffff000;
  size_a = uVar3 - uVar1;
  if (uVar4 < size_a + (long)expand_edata) {
    return extent_split_interior_cant_alloc;
  }
  peVar5 = (edata_t *)(uVar4 - size_a);
  *lead = (edata_t *)0x0;
  *trail = (edata_t *)0x0;
  *to_leak = (edata_t *)0x0;
  *to_salvage = (edata_t *)0x0;
  if (uVar3 != uVar1) {
    peVar2 = *edata;
    *lead = peVar2;
    peVar2 = extent_split_impl(tsdn,pac,ehooks,peVar2,size_a,(size_t)peVar5,
                               (_Bool)in_stack_ffffffffffffffb8);
    *edata = peVar2;
    if (peVar2 == (edata_t *)0x0) {
      *to_leak = *lead;
      edata = lead;
      goto LAB_0119726b;
    }
  }
  if (peVar5 == expand_edata) {
    return extent_split_interior_ok;
  }
  peVar5 = extent_split_impl(tsdn,pac,ehooks,*edata,(size_t)expand_edata,
                             (long)peVar5 - (long)expand_edata,(_Bool)in_stack_ffffffffffffffb8);
  *trail = peVar5;
  if (peVar5 != (edata_t *)0x0) {
    return extent_split_interior_ok;
  }
  *to_leak = *edata;
  *to_salvage = *lead;
  *lead = (edata_t *)0x0;
LAB_0119726b:
  *edata = (edata_t *)0x0;
  return extent_split_interior_error;
}

Assistant:

static extent_split_interior_result_t
extent_split_interior(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    /* The result of splitting, in case of success. */
    edata_t **edata, edata_t **lead, edata_t **trail,
    /* The mess to clean up, in case of error. */
    edata_t **to_leak, edata_t **to_salvage,
    edata_t *expand_edata, size_t size, size_t alignment) {
	size_t leadsize = ALIGNMENT_CEILING((uintptr_t)edata_base_get(*edata),
	    PAGE_CEILING(alignment)) - (uintptr_t)edata_base_get(*edata);
	assert(expand_edata == NULL || leadsize == 0);
	if (edata_size_get(*edata) < leadsize + size) {
		return extent_split_interior_cant_alloc;
	}
	size_t trailsize = edata_size_get(*edata) - leadsize - size;

	*lead = NULL;
	*trail = NULL;
	*to_leak = NULL;
	*to_salvage = NULL;

	/* Split the lead. */
	if (leadsize != 0) {
		assert(!edata_guarded_get(*edata));
		*lead = *edata;
		*edata = extent_split_impl(tsdn, pac, ehooks, *lead, leadsize,
		    size + trailsize, /* holding_core_locks*/ true);
		if (*edata == NULL) {
			*to_leak = *lead;
			*lead = NULL;
			return extent_split_interior_error;
		}
	}

	/* Split the trail. */
	if (trailsize != 0) {
		assert(!edata_guarded_get(*edata));
		*trail = extent_split_impl(tsdn, pac, ehooks, *edata, size,
		    trailsize, /* holding_core_locks */ true);
		if (*trail == NULL) {
			*to_leak = *edata;
			*to_salvage = *lead;
			*lead = NULL;
			*edata = NULL;
			return extent_split_interior_error;
		}
	}

	return extent_split_interior_ok;
}